

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

EVstone INT_REValloc_stone(CMConnection conn)

{
  int iVar1;
  CMFormat p_Var2;
  undefined8 *in_RDI;
  EValloc_stone_request request;
  EV_int_response response;
  CMFormat f;
  int cond;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  EVstone in_stack_ffffffffffffffe4;
  CMConnection in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar3;
  
  memset(&stack0xffffffffffffffdc,0,4);
  iVar1 = INT_CMCondition_get((CManager)
                              CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                              in_stack_ffffffffffffffe8);
  p_Var2 = INT_CMlookup_format((CManager)*in_RDI,EValloc_stone_req_formats);
  iVar3 = iVar1;
  if (p_Var2 == (CMFormat)0x0) {
    p_Var2 = INT_CMregister_format
                       ((CManager)0x0,
                        (FMStructDescList)
                        CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  INT_CMCondition_set_client_data
            ((CManager)CONCAT44(iVar3,in_stack_fffffffffffffff0),(int)((ulong)p_Var2 >> 0x20),
             (void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  INT_CMwrite((CMConnection)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
              (CMFormat)CONCAT44(iVar1,in_stack_ffffffffffffffd8),(void *)0x1546fc);
  INT_CMCondition_wait((CManager)response,request.condition_var);
  return in_stack_ffffffffffffffe4;
}

Assistant:

extern EVstone
INT_REValloc_stone(CMConnection conn)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EValloc_stone_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EValloc_stone_req_formats);
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EValloc_stone_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
    return (EVstone) response.ret;
}